

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetDebugAcknowledgeEvent(zet_debug_session_handle_t hDebug,zet_debug_event_t *event)

{
  zet_pfnDebugAcknowledgeEvent_t pfnAcknowledgeEvent;
  ze_result_t result;
  zet_debug_event_t *event_local;
  zet_debug_session_handle_t hDebug_local;
  
  pfnAcknowledgeEvent._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c970 != (code *)0x0) {
    pfnAcknowledgeEvent._4_4_ = (*DAT_0011c970)(hDebug,event);
  }
  return pfnAcknowledgeEvent._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugAcknowledgeEvent(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        const zet_debug_event_t* event                  ///< [in] a pointer to a ::zet_debug_event_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAcknowledgeEvent = context.zetDdiTable.Debug.pfnAcknowledgeEvent;
        if( nullptr != pfnAcknowledgeEvent )
        {
            result = pfnAcknowledgeEvent( hDebug, event );
        }
        else
        {
            // generic implementation
        }

        return result;
    }